

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O0

bool __thiscall
duckdb::WindowDistinctSortTree::TryNextRun
          (WindowDistinctSortTree *this,idx_t *level_idx,idx_t *run_idx)

{
  __int_type _Var1;
  size_type sVar2;
  pointer ppVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long *in_RDX;
  __int_type *in_RSI;
  vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
  *in_RDI;
  size_type count;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *zipped_tree;
  lock_guard<std::mutex> stage_guard;
  unsigned_long fanout;
  mutex_type *in_stack_ffffffffffffff68;
  vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
  *in_stack_ffffffffffffff70;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff78;
  vector<unsigned_long,_true> *__a;
  bool local_1;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  _Var1 = ::std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
  sVar2 = ::std::
          vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
          ::size(in_RDI);
  if (_Var1 < sVar2) {
    ppVar3 = (pointer)::std::__atomic_base::operator_cast_to_unsigned_long
                                ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
    if (in_RDI[4].
        super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= ppVar3) {
      __a = &in_RDI[4].
             super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[0xf].second;
      ::std::__atomic_base::operator_cast_to_unsigned_long
                ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
      pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                             *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff78 = &pvVar4->second;
      ::std::__atomic_base::operator_cast_to_unsigned_long
                ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
      vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
      ::operator[](in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      ::std::swap<duckdb::vector<unsigned_long,true>>(__a,in_stack_ffffffffffffff78);
      ::std::__atomic_base<unsigned_long>::operator++((__atomic_base<unsigned_long> *)(in_RDI + 3));
      _Var1 = ::std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
      sVar2 = ::std::
              vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
              ::size(in_RDI);
      if (sVar2 <= _Var1) {
        vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
        ::clear((vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 *)0x1a3b81c);
        local_1 = false;
        goto LAB_01a3b914;
      }
      this_00 = &MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
                 LowestLevel((MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                              *)0x1a3b858)->
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
      sVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
      in_RDI[4].
      super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)in_RDI[4].
                           super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start << 5);
      in_RDI[4].
      super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((long)in_RDI[4].
                            super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (sVar2 - 1)) /
                    (ulong)in_RDI[4].
                           super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      in_RDI[3].
      super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)__a,(__int_type)in_stack_ffffffffffffff78);
    }
    if (in_RDI[3].
        super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage <
        in_RDI[4].
        super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var1 = ::std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
      *in_RSI = _Var1;
      ppVar3 = in_RDI[3].
               super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      in_RDI[3].
      super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(ppVar3->first).
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
      *in_RDX = (long)ppVar3;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
LAB_01a3b914:
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a3b91e);
  return local_1;
}

Assistant:

bool WindowDistinctSortTree::TryNextRun(idx_t &level_idx, idx_t &run_idx) {
	const auto fanout = FANOUT;

	lock_guard<mutex> stage_guard(build_lock);

	//	Verify we are not done
	if (build_level >= tree.size()) {
		return false;
	}

	// Finished with this level?
	if (build_complete >= build_num_runs) {
		auto &zipped_tree = gdastate.zipped_tree;
		std::swap(tree[build_level].second, zipped_tree.tree[build_level].second);

		++build_level;
		if (build_level >= tree.size()) {
			zipped_tree.tree.clear();
			return false;
		}

		const auto count = LowestLevel().size();
		build_run_length *= fanout;
		build_num_runs = (count + build_run_length - 1) / build_run_length;
		build_run = 0;
		build_complete = 0;
	}

	// If all runs are in flight,
	// yield until the next level is ready
	if (build_run >= build_num_runs) {
		return false;
	}

	level_idx = build_level;
	run_idx = build_run++;

	return true;
}